

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

void __thiscall session::sendv(session *this,iobuf *bufs,int count)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  vector<iovec,_std::allocator<iovec>_> iov;
  char head_data [16];
  
  std::vector<iovec,_std::allocator<iovec>_>::vector
            (&iov,(long)(count + 1),(allocator_type *)head_data);
  uVar2 = 0;
  uVar4 = (ulong)(uint)count;
  if (count < 1) {
    uVar4 = uVar2;
  }
  iVar3 = 0;
  for (; uVar4 * 0x10 != uVar2; uVar2 = uVar2 + 0x10) {
    *(undefined8 *)
     ((long)&iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.super__Vector_impl_data.
             _M_start[1].iov_base + uVar2) = *(undefined8 *)((long)&bufs->data + uVar2);
    iVar1 = *(int *)((long)&bufs->len + uVar2);
    *(long *)((long)&iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.
                     super__Vector_impl_data._M_start[1].iov_len + uVar2) = (long)iVar1;
    iVar3 = iVar3 + iVar1;
  }
  iVar3 = encode_head(head_data,0x10,iVar3);
  (iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.super__Vector_impl_data._M_start)->
  iov_base = head_data;
  (iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.super__Vector_impl_data._M_start)->
  iov_len = (long)iVar3;
  transmit(this,iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.
                super__Vector_impl_data._M_start,
           (int)((ulong)((long)iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 4));
  std::_Vector_base<iovec,_std::allocator<iovec>_>::~_Vector_base
            (&iov.super__Vector_base<iovec,_std::allocator<iovec>_>);
  return;
}

Assistant:

void session::sendv(iobuf bufs[], int count)
{
    int total = 0;
    std::vector<iovec> iov(count + 1);
    for (int i = 0; i < count; i++)
    {
        iov[i+1].iov_base = (char*)bufs[i].data;
        iov[i+1].iov_len = bufs[i].len;
        total += bufs[i].len;
    }

    char head_data[16];
    int head_len = encode_head(head_data, sizeof(head_data), total);
    iov[0].iov_base = head_data;
    iov[0].iov_len = head_len;
    transmit(iov.data(), iov.size());
}